

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_send_stream(quicly_stream_t *stream,quicly_send_context_t *s)

{
  quicly_ranges_t *ranges;
  uint64_t *puVar1;
  ulong v;
  quicly_conn_t *pqVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  uint8_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t new_bytes;
  ulong uVar11;
  long lVar12;
  uint8_t *__dest;
  uint8_t *min_space;
  byte *__dest_00;
  size_t __n;
  size_t sStack_70;
  int wrote_all;
  size_t len;
  quicly_sent_t *sent;
  
  v = ((stream->sendstate).pending.ranges)->start;
  if (stream->stream_id < 0) {
    if (v < 0x40) {
      sStack_70 = 4;
    }
    else if (v < 0x4000) {
      sStack_70 = 5;
    }
    else {
      sStack_70 = (ulong)(0x3fffffff < v) * 4 + 7;
    }
    iVar7 = allocate_ack_eliciting_frame(stream->conn,s,sStack_70,&sent,on_ack_stream);
    if (iVar7 != 0) {
      return iVar7;
    }
    puVar8 = s->dst;
    s->dst = puVar8 + 1;
    *puVar8 = '\x06';
    puVar8 = ptls_encode_quicint(s->dst,v);
    s->dst = puVar8;
    __dest_00 = (byte *)0x0;
    uVar9 = (long)s->dst_end - (long)puVar8;
  }
  else {
    puVar8 = ptls_encode_quicint((uint8_t *)((long)&len + 1),stream->stream_id);
    if (v == 0) {
      len = CONCAT71(len._1_7_,8);
    }
    else {
      len = CONCAT71(len._1_7_,0xc);
      puVar8 = ptls_encode_quicint(puVar8,v);
    }
    uVar9 = (stream->sendstate).final_size;
    if (v == uVar9 && uVar9 != 0xffffffffffffffff) {
      len = len | 1;
      min_space = puVar8 + -(long)&len;
      iVar7 = allocate_ack_eliciting_frame(stream->conn,s,(size_t)min_space,&sent,on_ack_stream);
      if (iVar7 != 0) {
        return iVar7;
      }
      __dest = s->dst;
      if (min_space != s->dst_end + -(long)__dest) {
        len = len | 2;
        *puVar8 = '\0';
        __dest = s->dst;
        min_space = puVar8 + (1 - (long)&len);
      }
      memcpy(__dest,&len,(size_t)min_space);
      s->dst = s->dst + (long)min_space;
      wrote_all = 1;
      sStack_70 = 1;
      uVar9 = v;
      goto LAB_00117252;
    }
    __n = (long)puVar8 - (long)&len;
    iVar7 = allocate_ack_eliciting_frame(stream->conn,s,__n + 1,&sent,on_ack_stream);
    if (iVar7 != 0) {
      return iVar7;
    }
    __dest_00 = s->dst;
    memcpy(__dest_00,&len,__n);
    puVar8 = s->dst + __n;
    s->dst = puVar8;
    uVar10 = (long)s->dst_end - (long)puVar8;
    uVar4 = (stream->_send_aux).max_stream_data;
    uVar9 = uVar4 - v;
    if (uVar10 + v <= uVar4) {
      uVar9 = uVar10;
    }
    uVar4 = (stream->sendstate).size_inflight;
    if ((uVar4 < uVar9 + v) &&
       (uVar5 = (stream->conn->egress).max_data.permitted,
       uVar6 = (stream->conn->egress).max_data.sent, uVar5 - uVar6 < (uVar9 + v) - uVar4)) {
      uVar9 = (uVar4 + uVar5) - (uVar6 + v);
    }
  }
  uVar4 = (stream->sendstate).final_size;
  uVar10 = ((stream->sendstate).pending.ranges)->end;
  uVar11 = uVar10 - v;
  if (uVar4 < uVar10 && uVar4 != 0xffffffffffffffff) {
    if (uVar11 < 2) {
      __assert_fail("range_capacity > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xda6,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
    }
    uVar11 = uVar11 - 1;
  }
  if (uVar9 < uVar11) {
    uVar11 = uVar9;
  }
  if (uVar11 == 0) {
    __assert_fail("capacity != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xdae,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  len = uVar11;
  (*stream->callbacks->on_send_emit)
            (stream,v - ((stream->sendstate).acked.ranges)->end,puVar8,&len,&wrote_all);
  if (QUICLY_STATE_CONNECTED < (stream->conn->super).state) {
    return 0xff06;
  }
  if ((stream->_send_aux).reset_stream.sender_state != QUICLY_SENDER_STATE_NONE) {
    return 0;
  }
  if (uVar11 < len) {
    __assert_fail("len <= capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xdb8,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  if (len == 0) {
    __assert_fail("len != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xdb9,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  if (__dest_00 == (byte *)0x0) {
LAB_00117489:
    if (len < 0x40) {
      sStack_70 = 1;
    }
    else if (len < 0x4000) {
      sStack_70 = 2;
    }
    else {
      sStack_70 = (ulong)(0x3fffffff < len) * 4 + 4;
    }
    puVar8 = s->dst;
    uVar9 = (long)s->dst_end - (long)puVar8;
    if (uVar9 < sStack_70 + len) {
      len = uVar9 - sStack_70;
      wrote_all = 0;
    }
    memmove(puVar8 + sStack_70,puVar8,len);
    puVar8 = ptls_encode_quicint(s->dst,len);
  }
  else {
    puVar8 = s->dst;
    if (len < (ulong)((long)s->dst_end - (long)puVar8)) {
      *__dest_00 = *__dest_00 | 2;
      goto LAB_00117489;
    }
  }
  s->dst = puVar8 + len;
  uVar9 = len + v;
  uVar5 = (stream->sendstate).final_size;
  sStack_70 = 0;
  if ((uVar5 != 0xffffffffffffffff) && (uVar9 == uVar5)) {
    if (__dest_00 == (byte *)0x0) {
      __assert_fail("frame_type_at != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xdcc,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
    }
    *__dest_00 = *__dest_00 | 1;
    sStack_70 = 1;
  }
LAB_00117252:
  pqVar2 = stream->conn;
  lVar3 = stream->stream_id;
  puVar1 = &(pqVar2->super).stats.num_frames_sent.crypto + (ulong)(-1 < lVar3) * 2;
  *puVar1 = *puVar1 + 1;
  ranges = &(stream->sendstate).pending;
  puVar1 = &(stream->sendstate).size_inflight;
  lVar12 = uVar9 - *puVar1;
  if (*puVar1 <= uVar9 && lVar12 != 0) {
    if (-1 < lVar3) {
      puVar1 = &(pqVar2->egress).max_data.sent;
      *puVar1 = *puVar1 + lVar12;
    }
    (stream->sendstate).size_inflight = uVar9;
  }
  iVar7 = quicly_ranges_subtract(ranges,v,uVar9 + sStack_70);
  if ((iVar7 == 0) &&
     ((wrote_all == 0 ||
      (iVar7 = quicly_ranges_subtract(ranges,(stream->sendstate).size_inflight,0xffffffffffffffff),
      iVar7 == 0)))) {
    (sent->data).packet.packet_number = stream->stream_id;
    (sent->data).ack.range.end = v;
    (sent->data).stream.args.end = uVar9 + sStack_70;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int quicly_send_stream(quicly_stream_t *stream, quicly_send_context_t *s)
{
    uint64_t off = stream->sendstate.pending.ranges[0].start, end_off;
    quicly_sent_t *sent;
    uint8_t *frame_type_at;
    size_t capacity, len;
    int ret, wrote_all, is_fin;

    /* write frame type, stream_id and offset, calculate capacity */
    if (stream->stream_id < 0) {
        if ((ret = allocate_ack_eliciting_frame(stream->conn, s,
                                                1 + quicly_encodev_capacity(off) + 2 /* type + len + offset + 1-byte payload */,
                                                &sent, on_ack_stream)) != 0)
            return ret;
        frame_type_at = NULL;
        *s->dst++ = QUICLY_FRAME_TYPE_CRYPTO;
        s->dst = quicly_encodev(s->dst, off);
        capacity = s->dst_end - s->dst;
    } else {
        uint8_t header[18], *hp = header + 1;
        hp = quicly_encodev(hp, stream->stream_id);
        if (off != 0) {
            header[0] = QUICLY_FRAME_TYPE_STREAM_BASE | QUICLY_FRAME_TYPE_STREAM_BIT_OFF;
            hp = quicly_encodev(hp, off);
        } else {
            header[0] = QUICLY_FRAME_TYPE_STREAM_BASE;
        }
        if (!quicly_sendstate_is_open(&stream->sendstate) && off == stream->sendstate.final_size) {
            /* special case for emitting FIN only */
            header[0] |= QUICLY_FRAME_TYPE_STREAM_BIT_FIN;
            if ((ret = allocate_ack_eliciting_frame(stream->conn, s, hp - header, &sent, on_ack_stream)) != 0)
                return ret;
            if (hp - header != s->dst_end - s->dst) {
                header[0] |= QUICLY_FRAME_TYPE_STREAM_BIT_LEN;
                *hp++ = 0; /* empty length */
            }
            memcpy(s->dst, header, hp - header);
            s->dst += hp - header;
            end_off = off;
            wrote_all = 1;
            is_fin = 1;
            goto UpdateState;
        }
        if ((ret = allocate_ack_eliciting_frame(stream->conn, s, hp - header + 1, &sent, on_ack_stream)) != 0)
            return ret;
        frame_type_at = s->dst;
        memcpy(s->dst, header, hp - header);
        s->dst += hp - header;
        capacity = s->dst_end - s->dst;
        /* cap by max_stream_data */
        if (off + capacity > stream->_send_aux.max_stream_data)
            capacity = stream->_send_aux.max_stream_data - off;
        /* cap by max_data */
        if (off + capacity > stream->sendstate.size_inflight) {
            uint64_t new_bytes = off + capacity - stream->sendstate.size_inflight;
            if (new_bytes > stream->conn->egress.max_data.permitted - stream->conn->egress.max_data.sent) {
                size_t max_stream_data =
                    stream->sendstate.size_inflight + stream->conn->egress.max_data.permitted - stream->conn->egress.max_data.sent;
                capacity = max_stream_data - off;
            }
        }
    }
    { /* cap the capacity to the current range */
        uint64_t range_capacity = stream->sendstate.pending.ranges[0].end - off;
        if (!quicly_sendstate_is_open(&stream->sendstate) && off + range_capacity > stream->sendstate.final_size) {
            assert(range_capacity > 1); /* see the special case above */
            range_capacity -= 1;
        }
        if (capacity > range_capacity)
            capacity = range_capacity;
    }

    /* write payload */
    assert(capacity != 0);
    len = capacity;
    size_t emit_off = (size_t)(off - stream->sendstate.acked.ranges[0].end);
    QUICLY_PROBE(STREAM_ON_SEND_EMIT, stream->conn, stream->conn->stash.now, stream, emit_off, len);
    stream->callbacks->on_send_emit(stream, emit_off, s->dst, &len, &wrote_all);
    if (stream->conn->super.state >= QUICLY_STATE_CLOSING) {
        return QUICLY_ERROR_IS_CLOSING;
    } else if (stream->_send_aux.reset_stream.sender_state != QUICLY_SENDER_STATE_NONE) {
        return 0;
    }
    assert(len <= capacity);
    assert(len != 0);

    /* update s->dst, insert length if necessary */
    if (frame_type_at == NULL || len < s->dst_end - s->dst) {
        if (frame_type_at != NULL)
            *frame_type_at |= QUICLY_FRAME_TYPE_STREAM_BIT_LEN;
        size_t len_of_len = quicly_encodev_capacity(len);
        if (len_of_len + len > s->dst_end - s->dst) {
            len = s->dst_end - s->dst - len_of_len;
            wrote_all = 0;
        }
        memmove(s->dst + len_of_len, s->dst, len);
        s->dst = quicly_encodev(s->dst, len);
    }
    s->dst += len;
    end_off = off + len;

    /* determine if the frame incorporates FIN */
    if (!quicly_sendstate_is_open(&stream->sendstate) && end_off == stream->sendstate.final_size) {
        assert(frame_type_at != NULL);
        is_fin = 1;
        *frame_type_at |= QUICLY_FRAME_TYPE_STREAM_BIT_FIN;
    } else {
        is_fin = 0;
    }

UpdateState:
    if (stream->stream_id < 0) {
        ++stream->conn->super.stats.num_frames_sent.crypto;
    } else {
        ++stream->conn->super.stats.num_frames_sent.stream;
    }
    QUICLY_PROBE(STREAM_SEND, stream->conn, stream->conn->stash.now, stream, off, end_off - off, is_fin);
    QUICLY_PROBE(QUICTRACE_SEND_STREAM, stream->conn, stream->conn->stash.now, stream, off, end_off - off, is_fin);
    /* update sendstate (and also MAX_DATA counter) */
    if (stream->sendstate.size_inflight < end_off) {
        if (stream->stream_id >= 0)
            stream->conn->egress.max_data.sent += end_off - stream->sendstate.size_inflight;
        stream->sendstate.size_inflight = end_off;
    }
    if ((ret = quicly_ranges_subtract(&stream->sendstate.pending, off, end_off + is_fin)) != 0)
        return ret;
    if (wrote_all) {
        if ((ret = quicly_ranges_subtract(&stream->sendstate.pending, stream->sendstate.size_inflight, UINT64_MAX)) != 0)
            return ret;
    }

    /* setup sentmap */
    sent->data.stream.stream_id = stream->stream_id;
    sent->data.stream.args.start = off;
    sent->data.stream.args.end = end_off + is_fin;

    return 0;
}